

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CordOutputStream::Next(CordOutputStream *this,void **data,int *size)

{
  CordBuffer *this_00;
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  State SVar4;
  ulong uVar5;
  ulong uVar6;
  CordRepFlat *pCVar7;
  sbyte sVar8;
  ulong uVar9;
  size_t sVar10;
  char cVar11;
  int iVar12;
  sbyte sVar13;
  int iVar14;
  ulong len;
  Span<char> SVar15;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  anon_union_16_2_b9f6da03_for_Rep_1 local_48;
  void **local_38;
  
  bVar1 = (this->cord_).contents_.data_.rep_.field_0.data[0];
  uVar9 = (ulong)(char)bVar1;
  if ((uVar9 & 1) == 0) {
    uVar5 = uVar9 >> 1;
  }
  else {
    uVar5 = ((this->cord_).contents_.data_.rep_.field_0.as_tree.rep)->length;
  }
  this_00 = &this->buffer_;
  bVar2 = (this->buffer_).rep_.field_0.short_rep.raw_size;
  cVar11 = (char)bVar2 >> 1;
  if ((bVar2 & 1) == 0) {
    sVar10 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).length;
  }
  else {
    sVar10 = (size_t)cVar11;
  }
  uVar5 = sVar10 + uVar5;
  uVar6 = 0x80;
  if (0x80 < uVar5) {
    uVar6 = uVar5;
  }
  len = this->size_hint_ - uVar5;
  uVar3 = len;
  if (this->size_hint_ < uVar5 || len == 0) {
    len = uVar6;
    uVar3 = 0xffffffffffffffff;
  }
  if (this->state_ < 4) {
    switch(this->state_) {
    case kFull:
      if ((bVar2 & 1) == 0) {
        sVar10 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).length;
      }
      else {
        sVar10 = (size_t)cVar11;
      }
      if (sVar10 == 0) {
        __assert_fail("buffer_.length() > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                      ,0x26a,
                      "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
      }
      local_48.long_rep.rep = (this_00->rep_).field_0.long_rep.rep;
      local_48.long_rep.padding = (this->buffer_).rep_.field_0.long_rep.padding;
      (this_00->rep_).field_0.short_rep.raw_size = '\x01';
      absl::lts_20240722::Cord::Append(&this->cord_,(CordBuffer *)&local_48.long_rep);
      if (((ulong)local_48.long_rep.rep & 1) == 0) {
        absl::lts_20240722::cord_internal::CordRepFlat::Delete
                  (&(local_48.long_rep.rep)->super_CordRep);
      }
    case kEmpty:
      bVar1 = (this_00->rep_).field_0.short_rep.raw_size;
      if ((bVar1 & 1) == 0) {
        sVar10 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).length;
      }
      else {
        sVar10 = (size_t)((char)bVar1 >> 1);
      }
      local_38 = data;
      if (sVar10 != 0) {
        __assert_fail("buffer_.length() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                      ,0x26e,
                      "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
      }
      pCVar7 = (CordRepFlat *)0x1;
      if (0xf < len) {
        pCVar7 = absl::lts_20240722::cord_internal::CordRepFlat::NewImpl<4096ul>(len);
        (pCVar7->super_CordRep).length = 0;
      }
      if (((this_00->rep_).field_0.short_rep.raw_size & 1U) == 0) {
        absl::lts_20240722::cord_internal::CordRepFlat::Delete
                  (&((this_00->rep_).field_0.long_rep.rep)->super_CordRep);
      }
      (this->buffer_).rep_.field_0.long_rep.rep = pCVar7;
      (this->buffer_).rep_.field_0.long_rep.padding = (void *)0x0;
      data = local_38;
      break;
    case kPartial:
      if ((bVar2 & 1) == 0) {
        uVar9 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).length;
      }
      else {
        uVar9 = (ulong)cVar11;
      }
      uVar5 = 0xf;
      if ((bVar2 & 1) == 0) {
        bVar1 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).tag;
        iVar12 = -0xb8000;
        if (bVar1 < 0xbb) {
          iVar12 = -0xe80;
        }
        sVar13 = 0xc;
        if (bVar1 < 0xbb) {
          sVar13 = 6;
        }
        iVar14 = -0x10;
        if (0x42 < bVar1) {
          iVar14 = iVar12;
        }
        sVar8 = 3;
        if (0x42 < bVar1) {
          sVar8 = sVar13;
        }
        uVar5 = (ulong)(int)(((uint)bVar1 << sVar8) + iVar14 + -0xd);
      }
      if (uVar5 <= uVar9) {
        __assert_fail("buffer_.length() < buffer_.capacity()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                      ,0x267,
                      "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
      }
      break;
    case kSteal:
      if ((bVar2 & 1) == 0) {
        sVar10 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).length;
      }
      else {
        sVar10 = (size_t)cVar11;
      }
      if (sVar10 != 0) {
        __assert_fail("buffer_.length() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                      ,0x262,
                      "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
      }
      if ((bVar1 & 1) == 0) {
        uVar9 = uVar9 >> 1;
      }
      else {
        uVar9 = ((this->cord_).contents_.data_.rep_.field_0.as_tree.rep)->length;
      }
      if (uVar9 == 0) {
        if (len < 0x10) {
          local_58 = 1;
          uStack_57 = 0;
          uStack_50 = 0;
          uStack_4f = 0;
        }
        else {
          pCVar7 = absl::lts_20240722::cord_internal::CordRepFlat::NewImpl<4096ul>(len);
          (pCVar7->super_CordRep).length = 0;
          local_58 = SUB81(pCVar7,0);
          uStack_57 = (undefined7)((ulong)pCVar7 >> 8);
        }
      }
      else {
        absl::lts_20240722::Cord::GetAppendBufferSlowPath((ulong)&local_58,(ulong)&this->cord_,0);
      }
      if (((this_00->rep_).field_0.short_rep.raw_size & 1U) == 0) {
        absl::lts_20240722::cord_internal::CordRepFlat::Delete
                  (&((this_00->rep_).field_0.long_rep.rep)->super_CordRep);
      }
      (this_00->rep_).field_0.long_rep.rep = (CordRepFlat *)CONCAT71(uStack_57,local_58);
      (this->buffer_).rep_.field_0.long_rep.padding = (void *)CONCAT71(uStack_4f,uStack_50);
    }
  }
  if (((this_00->rep_).field_0.short_rep.raw_size & 1U) == 0) {
    SVar15 = absl::lts_20240722::CordBuffer::Rep::long_available(&this_00->rep_);
  }
  else {
    SVar15 = absl::lts_20240722::CordBuffer::Rep::short_available(&this_00->rep_);
  }
  uVar9 = SVar15.len_;
  if (uVar9 != 0) {
    *data = SVar15.ptr_;
    if (uVar3 < uVar9) {
      *size = (int)uVar3;
      bVar1 = (this_00->rep_).field_0.short_rep.raw_size;
      uVar9 = 0xf;
      if ((bVar1 & 1) == 0) {
        bVar2 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).tag;
        iVar12 = -0xb8000;
        if (bVar2 < 0xbb) {
          iVar12 = -0xe80;
        }
        sVar13 = 0xc;
        if (bVar2 < 0xbb) {
          sVar13 = 6;
        }
        iVar14 = -0x10;
        if (0x42 < bVar2) {
          iVar14 = iVar12;
        }
        sVar8 = 3;
        if (0x42 < bVar2) {
          sVar8 = sVar13;
        }
        uVar9 = (ulong)(int)(((uint)bVar2 << sVar8) + iVar14 + -0xd);
      }
      if (uVar3 <= uVar9) {
        if ((bVar1 & 1) == 0) {
          sVar10 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).length;
        }
        else {
          sVar10 = (size_t)((char)bVar1 >> 1);
        }
        uVar9 = 0xf;
        if ((bVar1 & 1) == 0) {
          bVar2 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).tag;
          iVar12 = -0xb8000;
          if (bVar2 < 0xbb) {
            iVar12 = -0xe80;
          }
          sVar13 = 0xc;
          if (bVar2 < 0xbb) {
            sVar13 = 6;
          }
          iVar14 = -0x10;
          if (0x42 < bVar2) {
            iVar14 = iVar12;
          }
          sVar8 = 3;
          if (0x42 < bVar2) {
            sVar8 = sVar13;
          }
          uVar9 = (ulong)(int)(((uint)bVar2 << sVar8) + iVar14 + -0xd);
        }
        if (sVar10 + uVar3 <= uVar9) {
          if ((bVar1 & 1) == 0) {
            pCVar7 = (this_00->rep_).field_0.long_rep.rep;
            (pCVar7->super_CordRep).length = (pCVar7->super_CordRep).length + uVar3;
          }
          else {
            (this_00->rep_).field_0.short_rep.raw_size = bVar1 + (char)uVar3 * '\x02';
          }
          SVar4 = kPartial;
LAB_002be3ce:
          this->state_ = SVar4;
          return true;
        }
      }
      Next();
    }
    else {
      *size = (int)SVar15.len_;
      bVar1 = (this_00->rep_).field_0.short_rep.raw_size;
      uVar5 = 0xf;
      if ((bVar1 & 1) == 0) {
        bVar2 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).tag;
        iVar12 = -0xb8000;
        if (bVar2 < 0xbb) {
          iVar12 = -0xe80;
        }
        sVar13 = 0xc;
        if (bVar2 < 0xbb) {
          sVar13 = 6;
        }
        iVar14 = -0x10;
        if (0x42 < bVar2) {
          iVar14 = iVar12;
        }
        sVar8 = 3;
        if (0x42 < bVar2) {
          sVar8 = sVar13;
        }
        uVar5 = (ulong)(int)(((uint)bVar2 << sVar8) + iVar14 + -0xd);
      }
      if (uVar9 <= uVar5) {
        if ((bVar1 & 1) == 0) {
          sVar10 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).length;
        }
        else {
          sVar10 = (size_t)((char)bVar1 >> 1);
        }
        uVar5 = 0xf;
        if ((bVar1 & 1) == 0) {
          bVar2 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).tag;
          iVar12 = -0xb8000;
          if (bVar2 < 0xbb) {
            iVar12 = -0xe80;
          }
          sVar13 = 0xc;
          if (bVar2 < 0xbb) {
            sVar13 = 6;
          }
          iVar14 = -0x10;
          if (0x42 < bVar2) {
            iVar14 = iVar12;
          }
          sVar8 = 3;
          if (0x42 < bVar2) {
            sVar8 = sVar13;
          }
          uVar5 = (ulong)(int)(((uint)bVar2 << sVar8) + iVar14 + -0xd);
        }
        if (sVar10 + uVar9 <= uVar5) {
          if ((bVar1 & 1) == 0) {
            pCVar7 = (this_00->rep_).field_0.long_rep.rep;
            (pCVar7->super_CordRep).length = (pCVar7->super_CordRep).length + uVar9;
          }
          else {
            (this_00->rep_).field_0.short_rep.raw_size = bVar1 + (char)SVar15.len_ * '\x02';
          }
          SVar4 = kFull;
          goto LAB_002be3ce;
        }
      }
    }
    Next();
  }
  __assert_fail("!span.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                ,0x275,"virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
}

Assistant:

bool CordOutputStream::Next(void** data, int* size) {
  // Use 128 bytes as a minimum buffer size if we don't have any application
  // provided size hints. This number is picked somewhat arbitrary as 'small
  // enough to avoid excessive waste on small data, and large enough to not
  // waste CPU and memory on tiny buffer overhead'.
  // It is worth noting that absent size hints, we pick 'current size' as
  // the default buffer size (capped at max flat size), which means we quickly
  // double the buffer size. This is in contrast to `Cord::Append()` functions
  // accepting strings which use a conservative 10% growth.
  static const size_t kMinBlockSize = 128;

  size_t desired_size, max_size;
  const size_t cord_size = cord_.size() + buffer_.length();
  if (size_hint_ > cord_size) {
    // Try to hit size_hint_ exactly so the caller doesn't receive a larger
    // buffer than indicated, requiring a non-zero call to BackUp() to undo
    // the buffer capacity we returned beyond the indicated size hint.
    desired_size = size_hint_ - cord_size;
    max_size = desired_size;
  } else {
    // We're past the size hint or don't have a size hint.  Try to allocate a
    // block as large as what we have so far, or at least kMinBlockSize bytes.
    // CordBuffer will truncate this to an appropriate size if it is too large.
    desired_size = std::max(cord_size, kMinBlockSize);
    max_size = std::numeric_limits<size_t>::max();
  }

  switch (state_) {
    case State::kSteal:
      // Steal last buffer from Cord if available.
      assert(buffer_.length() == 0);
      buffer_ = cord_.GetAppendBuffer(desired_size);
      break;
    case State::kPartial:
      // Use existing capacity in 'buffer_`
      assert(buffer_.length() < buffer_.capacity());
      break;
    case State::kFull:
      assert(buffer_.length() > 0);
      cord_.Append(std::move(buffer_));
      ABSL_FALLTHROUGH_INTENDED;
    case State::kEmpty:
      assert(buffer_.length() == 0);
      buffer_ = absl::CordBuffer::CreateWithDefaultLimit(desired_size);
      break;
  }

  // Get all available capacity from the buffer.
  absl::Span<char> span = buffer_.available();
  assert(!span.empty());
  *data = span.data();

  // Only hand out up to 'max_size', which is limited if there is a size hint
  // specified, and we have more available than the size hint.
  if (span.size() > max_size) {
    *size = static_cast<int>(max_size);
    buffer_.IncreaseLengthBy(max_size);
    state_ = State::kPartial;
  } else {
    *size = static_cast<int>(span.size());
    buffer_.IncreaseLengthBy(span.size());
    state_ = State::kFull;
  }

  return true;
}